

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trivialre.h
# Opt level: O0

Matcher * __thiscall
trivialre::re_compiler::C<StringTestingBuilder,trivialre::re_compiler::ErrorPolicy>::
CompileOrDie_abi_cxx11_
          (Matcher *__return_storage_ptr__,
          C<StringTestingBuilder,trivialre::re_compiler::ErrorPolicy> *this,string_view str)

{
  string_view str_00;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  string_view local_a0;
  string_view *local_90;
  type *new_str;
  type *maybe_m;
  size_t local_78;
  ParseResult local_70;
  C<StringTestingBuilder,_trivialre::re_compiler::ErrorPolicy> *local_38;
  char *local_30;
  C<StringTestingBuilder,trivialre::re_compiler::ErrorPolicy> *local_28;
  C<StringTestingBuilder,_trivialre::re_compiler::ErrorPolicy> *this_local;
  string_view str_local;
  
  local_30 = str._M_str;
  local_38 = (C<StringTestingBuilder,_trivialre::re_compiler::ErrorPolicy> *)str._M_len;
  local_28 = this;
  this_local = local_38;
  str_local._M_len = (size_t)local_30;
  str_local._M_str = (char *)__return_storage_ptr__;
  ErrorPolicy::StartedParsing((ErrorPolicy *)this,str);
  maybe_m = (type *)this_local;
  local_78 = str_local._M_len;
  str_00._M_str = (char *)str_local._M_len;
  str_00._M_len = (size_t)this_local;
  ParseAlt_abi_cxx11_(&local_70,this,str_00);
  new_str = (type *)std::
                    get<0ul,std::optional<std::__cxx11::string>,std::basic_string_view<char,std::char_traits<char>>>
                              (&local_70);
  local_90 = std::
             get<1ul,std::optional<std::__cxx11::string>,std::basic_string_view<char,std::char_traits<char>>>
                       (&local_70);
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(local_90);
  if (!bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_a0,"failed to parse entire re string");
    ErrorPolicy::NoteError((ErrorPolicy *)this,local_a0,*local_90);
  }
  bVar1 = std::optional::operator_cast_to_bool((optional *)new_str);
  if (bVar1) {
    pbVar2 = std::
             optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)new_str);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pbVar2);
  }
  else {
    StringTestingBuilder::Any_abi_cxx11_();
  }
  std::
  pair<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::~pair(&local_70);
  return __return_storage_ptr__;
}

Assistant:

Matcher CompileOrDie(std::string_view str) {
    ErrorPolicy::StartedParsing(str);
    auto [maybe_m, new_str] = ParseAlt(str);
    if (!new_str.empty()) {
      ErrorPolicy::NoteError("failed to parse entire re string", new_str);
    }
    if (!maybe_m) {
      return builder.Any();
    }
    return maybe_m.value();
  }